

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

golf_model_t *
golf_model_dynamic(vec_golf_group_t groups,vec_vec3_t positions,vec_vec3_t normals,
                  vec_vec2_t texcoords)

{
  golf_model_t *in_RDI;
  
  (in_RDI->groups).alloc_category = groups.alloc_category;
  (in_RDI->groups).data = groups.data;
  (in_RDI->groups).length = groups.length;
  (in_RDI->groups).capacity = groups.capacity;
  (in_RDI->positions).alloc_category = positions.alloc_category;
  (in_RDI->positions).data = positions.data;
  (in_RDI->positions).length = positions.length;
  (in_RDI->positions).capacity = positions.capacity;
  (in_RDI->normals).data = normals.data;
  (in_RDI->normals).length = normals.length;
  (in_RDI->normals).capacity = normals.capacity;
  (in_RDI->normals).alloc_category = normals.alloc_category;
  (in_RDI->texcoords).data = texcoords.data;
  (in_RDI->texcoords).length = texcoords.length;
  (in_RDI->texcoords).capacity = texcoords.capacity;
  (in_RDI->texcoords).alloc_category = texcoords.alloc_category;
  in_RDI->is_water = false;
  in_RDI->sg_size = 0;
  return in_RDI;
}

Assistant:

golf_model_t golf_model_dynamic(vec_golf_group_t groups, vec_vec3_t positions, vec_vec3_t normals, vec_vec2_t texcoords) {
    golf_model_t model;
    model.groups = groups;
    model.positions = positions;
    model.normals = normals;
    model.texcoords = texcoords;
    model.is_water = false;
    model.sg_size = 0;
    return model;
}